

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_utils.c
# Opt level: O0

cio_error cio_linux_get_socket_error(int fd)

{
  int iVar1;
  int *piVar2;
  socklen_t local_18;
  int ret;
  socklen_t len;
  int error;
  int fd_local;
  
  ret = 0;
  local_18 = 4;
  len = fd;
  iVar1 = getsockopt(fd,1,4,&ret,&local_18);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    ret = *piVar2;
  }
  error = -ret;
  return error;
}

Assistant:

enum cio_error cio_linux_get_socket_error(int fd)
{
	int error = 0;
	socklen_t len = sizeof(error);
	int ret = getsockopt(fd, SOL_SOCKET, SO_ERROR, &error, &len);
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	return (enum cio_error)(-error);
}